

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O2

void ares_uri_destroy(ares_uri_t *uri)

{
  if (uri != (ares_uri_t *)0x0) {
    ares_free(uri->username);
    ares_free(uri->password);
    ares_free(uri->path);
    ares_free(uri->fragment);
    ares_htable_dict_destroy(uri->query);
    ares_free(uri);
    return;
  }
  return;
}

Assistant:

void ares_uri_destroy(ares_uri_t *uri)
{
  if (uri == NULL) {
    return;
  }

  ares_free(uri->username);
  ares_free(uri->password);
  ares_free(uri->path);
  ares_free(uri->fragment);
  ares_htable_dict_destroy(uri->query);
  ares_free(uri);
}